

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceSpec.cxx
# Opt level: O0

bool __thiscall cmCTestResourceSpec::Resource::operator==(Resource *this,Resource *other)

{
  __type _Var1;
  bool local_19;
  Resource *other_local;
  Resource *this_local;
  
  _Var1 = std::operator==(&this->Id,&other->Id);
  local_19 = false;
  if (_Var1) {
    local_19 = this->Capacity == other->Capacity;
  }
  return local_19;
}

Assistant:

bool cmCTestResourceSpec::Resource::operator==(
  const cmCTestResourceSpec::Resource& other) const
{
  return this->Id == other.Id && this->Capacity == other.Capacity;
}